

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O2

void __thiscall YAML::detail::node_data::compute_map_size(node_data *this)

{
  _List_iterator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_> _Var1;
  _List_iterator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_> __x;
  
  _Var1._M_node =
       (this->m_undefinedPairs).
       super__List_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  while (__x._M_node = _Var1._M_node, __x._M_node != (_List_node_base *)&this->m_undefinedPairs) {
    _Var1 = std::next<std::_List_iterator<std::pair<YAML::detail::node*,YAML::detail::node*>>>
                      (__x,1);
    if ((*(char *)&(__x._M_node[1]._M_next)->_M_next->_M_next->_M_next == '\x01') &&
       (*(char *)&(__x._M_node[1]._M_prev)->_M_next->_M_next->_M_next == '\x01')) {
      std::__cxx11::
      list<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
      ::erase(&this->m_undefinedPairs,(const_iterator)__x._M_node);
    }
  }
  return;
}

Assistant:

void node_data::compute_map_size() const {
  auto it = m_undefinedPairs.begin();
  while (it != m_undefinedPairs.end()) {
    auto jt = std::next(it);
    if (it->first->is_defined() && it->second->is_defined())
      m_undefinedPairs.erase(it);
    it = jt;
  }
}